

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_yv12_copy_frame_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int num_planes)

{
  bool bVar1;
  uint uVar2;
  void *__src;
  void *__dest;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int row_1;
  int is_uv_1;
  uint8_t *plane_dst_1;
  uint8_t *plane_src_1;
  int plane_1;
  int row;
  int is_uv;
  uint8_t *plane_dst;
  uint8_t *plane_src;
  int plane;
  undefined4 local_50;
  int in_stack_ffffffffffffffb4;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  undefined4 local_34;
  undefined4 local_30;
  long in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
      __src = *(void **)(in_RDI + 0x28 + (long)local_34 * 8);
      __dest = *(void **)(in_RSI + 0x28 + (long)local_34 * 8);
      uVar2 = (uint)(0 < local_34);
      for (local_50 = 0; local_50 < *(int *)(in_RDI + 8 + (long)(int)uVar2 * 4);
          local_50 = local_50 + 1) {
        memcpy(__dest,__src,(long)*(int *)(in_RDI + (long)(int)uVar2 * 4));
        __src = (void *)((long)__src + (long)*(int *)(in_RDI + 0x20 + (long)(int)uVar2 * 4));
        __dest = (void *)((long)__dest + (long)*(int *)(in_RSI + 0x20 + (long)(int)uVar2 * 4));
      }
    }
    aom_yv12_extend_frame_borders_c
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  else {
    for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
      in_stack_ffffffffffffffe0 = *(long *)(in_RDI + 0x28 + (long)iVar3 * 8);
      bVar1 = 0 < iVar3;
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 8 + (long)(int)(uint)bVar1 * 4);
          local_30 = local_30 + 1) {
        memcpy_short_addr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb4);
        in_stack_ffffffffffffffe0 =
             in_stack_ffffffffffffffe0 + *(int *)(in_RDI + 0x20 + (long)(int)(uint)bVar1 * 4);
      }
    }
    aom_yv12_extend_frame_borders_c
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_EDX,iVar3),
               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  return;
}

Assistant:

void aom_yv12_copy_frame_c(const YV12_BUFFER_CONFIG *src_bc,
                           YV12_BUFFER_CONFIG *dst_bc, const int num_planes) {
  assert(src_bc->y_width == dst_bc->y_width);
  assert(src_bc->y_height == dst_bc->y_height);

#if CONFIG_AV1_HIGHBITDEPTH
  assert((src_bc->flags & YV12_FLAG_HIGHBITDEPTH) ==
         (dst_bc->flags & YV12_FLAG_HIGHBITDEPTH));

  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const uint8_t *plane_src = src_bc->buffers[plane];
      uint8_t *plane_dst = dst_bc->buffers[plane];
      const int is_uv = plane > 0;

      for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
        memcpy_short_addr(plane_dst, plane_src, src_bc->widths[is_uv]);
        plane_src += src_bc->strides[is_uv];
        plane_dst += dst_bc->strides[is_uv];
      }
    }
    aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
    return;
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint8_t *plane_src = src_bc->buffers[plane];
    uint8_t *plane_dst = dst_bc->buffers[plane];
    const int is_uv = plane > 0;

    for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
      memcpy(plane_dst, plane_src, src_bc->widths[is_uv]);
      plane_src += src_bc->strides[is_uv];
      plane_dst += dst_bc->strides[is_uv];
    }
  }
  aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
}